

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiprec_convolve_test_util.cc
# Opt level: O3

void __thiscall
libaom_test::AV1HighbdHiprecConvolve::AV1HighbdHiprecConvolveTest::RunCheckOutput
          (AV1HighbdHiprecConvolveTest *this,highbd_hiprec_convolve_func test_impl)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  ParamType *pPVar9;
  WienerConvolveParams WVar10;
  uint8_t *dst;
  uint8_t *puVar11;
  ulong uVar12;
  long lVar13;
  uint8_t *src;
  SEARCH_METHODS *pSVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ACMRandom *rnd;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  InterpKernel hkernel;
  AssertHelper local_c8;
  undefined8 *local_c0;
  InterpKernel vkernel;
  int local_a8;
  _Head_base<0UL,_unsigned_short_*,_false> local_a0;
  _Head_base<0UL,_unsigned_short_*,_false> local_98;
  long local_90;
  ulong local_88;
  AssertHelper local_80;
  _Head_base<0UL,_unsigned_short_*,_false> local_78;
  int local_6c;
  uint32_t local_68;
  uint32_t local_64;
  ulong local_60;
  WienerConvolveParams conv_params;
  
  pPVar9 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  iVar5 = *(int *)&(pPVar9->
                   super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   ).
                   super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .field_0x14;
  lVar15 = (long)iVar5;
  pPVar9 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  uVar7 = (pPVar9->
          super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
          ).
          super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
          .super__Head_base<1UL,_int,_false>._M_head_impl;
  uVar16 = (ulong)uVar7;
  pPVar9 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  iVar1 = *(int *)&(pPVar9->
                   super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   ).
                   super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .
                   super__Tuple_impl<2UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .
                   super__Tuple_impl<3UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .field_0xc;
  pPVar9 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  uVar2 = (pPVar9->
          super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
          ).
          super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
          .
          super__Tuple_impl<2UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
          .
          super__Tuple_impl<3UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
          .super__Head_base<3UL,_int,_false>._M_head_impl;
  WVar10.round_0 = uVar2 - 7;
  WVar10.round_1 = 0x15 - uVar2;
  conv_params.round_0 = 3;
  conv_params.round_1 = 0xb;
  if (10 < (int)uVar2) {
    conv_params = WVar10;
  }
  local_78._M_head_impl = (unsigned_short *)operator_new__(0x8000,(nothrow_t *)&std::nothrow);
  vkernel[0] = 0;
  vkernel[1] = 0;
  vkernel[2] = 0;
  vkernel[3] = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
            ((internal *)hkernel,"input","nullptr",
             (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)&local_78,
             (void **)vkernel);
  uVar3 = hkernel._8_8_;
  if ((char)hkernel[0] == '\0') {
    testing::Message::Message((Message *)vkernel);
    if (hkernel._8_8_ == 0) {
      pSVar14 = "";
    }
    else {
      pSVar14 = *(SEARCH_METHODS **)hkernel._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
               ,0x10c,(char *)pSVar14);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)vkernel);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (vkernel._0_8_ != 0) {
      (**(code **)(*(long *)vkernel._0_8_ + 8))();
    }
    if (hkernel._8_8_ != 0) {
      if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
        operator_delete(*(void **)hkernel._8_8_);
      }
      operator_delete((void *)hkernel._8_8_);
    }
  }
  else {
    if (hkernel._8_8_ != 0) {
      if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
        operator_delete(*(void **)hkernel._8_8_);
      }
      operator_delete((void *)uVar3);
    }
    iVar5 = (iVar5 + 0xfU & 0xfffffff0) * uVar7;
    uVar12 = 0xffffffffffffffff;
    if (-1 < iVar5) {
      uVar12 = (long)iVar5 * 2;
    }
    local_98._M_head_impl = (unsigned_short *)operator_new__(uVar12,(nothrow_t *)&std::nothrow);
    vkernel[0] = 0;
    vkernel[1] = 0;
    vkernel[2] = 0;
    vkernel[3] = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
              ((internal *)hkernel,"output","nullptr",
               (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)&local_98,
               (void **)vkernel);
    uVar3 = hkernel._8_8_;
    if ((char)hkernel[0] == '\0') {
      testing::Message::Message((Message *)vkernel);
      if (hkernel._8_8_ == 0) {
        pSVar14 = "";
      }
      else {
        pSVar14 = *(SEARCH_METHODS **)hkernel._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                 ,0x113,(char *)pSVar14);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)vkernel);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (vkernel._0_8_ != 0) {
        (**(code **)(*(long *)vkernel._0_8_ + 8))();
      }
      if (hkernel._8_8_ != 0) {
        if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
          operator_delete(*(void **)hkernel._8_8_);
        }
        operator_delete((void *)hkernel._8_8_);
      }
    }
    else {
      local_88 = uVar16;
      if (hkernel._8_8_ != 0) {
        if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
          operator_delete(*(void **)hkernel._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      local_a0._M_head_impl = (unsigned_short *)operator_new__(uVar12,(nothrow_t *)&std::nothrow);
      vkernel[0] = 0;
      vkernel[1] = 0;
      vkernel[2] = 0;
      vkernel[3] = 0;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
                ((internal *)hkernel,"output2","nullptr",
                 (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)&local_a0,
                 (void **)vkernel);
      if ((char)hkernel[0] == '\0') {
        testing::Message::Message((Message *)vkernel);
        if (hkernel._8_8_ == 0) {
          pSVar14 = "";
        }
        else {
          pSVar14 = *(SEARCH_METHODS **)hkernel._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                   ,0x115,(char *)pSVar14);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)vkernel);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (vkernel._0_8_ != 0) {
          (**(code **)(*(long *)vkernel._0_8_ + 8))();
        }
        if (hkernel._8_8_ != 0) {
          local_c0 = (undefined8 *)hkernel._8_8_;
          if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
            operator_delete(*(void **)hkernel._8_8_);
          }
LAB_004745b3:
          operator_delete(local_c0);
        }
      }
      else {
        local_90 = lVar15;
        if (hkernel._8_8_ != 0) {
          if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
            operator_delete(*(void **)hkernel._8_8_);
          }
          operator_delete((void *)hkernel._8_8_);
        }
        rnd = &this->rnd_;
        lVar17 = 0;
        lVar15 = 0;
        local_60 = (ulong)uVar2;
        do {
          lVar13 = 0;
          do {
            uVar6 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
            *(ushort *)((long)local_78._M_head_impl + lVar13 * 2 + lVar17) =
                 (ushort)(uVar6 >> 0xf) & ~(ushort)(-1 << ((byte)uVar2 & 0x1f));
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x80);
          lVar15 = lVar15 + 1;
          lVar17 = lVar17 + 0x100;
        } while (lVar15 != 0x80);
        uVar16 = (ulong)local_78._M_head_impl >> 1;
        dst = (uint8_t *)((ulong)local_98._M_head_impl >> 1);
        puVar11 = (uint8_t *)((ulong)local_a0._M_head_impl >> 1);
        local_64 = 0x79 - (int)local_88;
        local_68 = 0x79 - (int)local_90;
        uVar7 = (int)local_88 * (int)local_90;
        iVar5 = 0;
        lVar15 = local_90;
        do {
          local_6c = iVar5;
          generate_kernels(rnd,hkernel,vkernel,iVar5);
          if (0 < iVar1) {
            local_a8 = 0;
            do {
              uVar6 = testing::internal::Random::Generate(&rnd->random_,local_64);
              uVar8 = testing::internal::Random::Generate(&rnd->random_,local_68);
              src = (uint8_t *)((long)(int)uVar8 + (long)(int)(uVar6 * 0x80 + 0x180) + uVar16 + 3);
              av1_highbd_wiener_convolve_add_src_c
                        (src,0x80,dst,lVar15,hkernel,0x10,vkernel,0x10,(int)lVar15,(int)local_88,
                         &conv_params,(int)local_60);
              (*test_impl)(src,0x80,puVar11,lVar15,hkernel,0x10,vkernel,0x10,(int)lVar15,
                           (int)local_88,&conv_params,(int)local_60);
              if (0 < (int)uVar7) {
                lVar15 = 0;
                iVar5 = 0;
                do {
                  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                            ((internal *)&local_c8,"output[j]","output2[j]",
                             local_98._M_head_impl + lVar15,local_a0._M_head_impl + lVar15);
                  puVar4 = local_c0;
                  if (local_c8.data_._0_1_ == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_e0._M_head_impl + 0x10),"Pixel mismatch at index ",
                               0x18);
                    lVar15 = local_90;
                    std::ostream::operator<<(local_e0._M_head_impl + 0x10,iVar5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_e0._M_head_impl + 0x10)," = (",4);
                    std::ostream::operator<<(local_e0._M_head_impl + 0x10,iVar5 % (int)lVar15);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_e0._M_head_impl + 0x10),", ",2);
                    std::ostream::operator<<(local_e0._M_head_impl + 0x10,iVar5 / (int)lVar15);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_e0._M_head_impl + 0x10),") on iteration ",0xf);
                    std::ostream::operator<<(local_e0._M_head_impl + 0x10,local_a8);
                    if (local_c0 == (undefined8 *)0x0) {
                      pSVar14 = "";
                    }
                    else {
                      pSVar14 = (SEARCH_METHODS *)*local_c0;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_80,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                               ,0x12e,(char *)pSVar14);
                    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper(&local_80);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                    if (local_c0 == (undefined8 *)0x0) goto LAB_004745bb;
                    if ((undefined8 *)*local_c0 != local_c0 + 2) {
                      operator_delete((undefined8 *)*local_c0);
                    }
                    goto LAB_004745b3;
                  }
                  if (local_c0 != (undefined8 *)0x0) {
                    if ((undefined8 *)*local_c0 != local_c0 + 2) {
                      operator_delete((undefined8 *)*local_c0);
                    }
                    operator_delete(puVar4);
                  }
                  iVar5 = iVar5 + 1;
                  lVar15 = lVar15 + 2;
                } while ((ulong)uVar7 * 2 != lVar15);
              }
              local_a8 = local_a8 + 1;
              lVar15 = local_90;
            } while (local_a8 != iVar1);
          }
          iVar5 = local_6c + 1;
        } while (iVar5 != 6);
      }
LAB_004745bb:
      if (local_a0._M_head_impl != (unsigned_short *)0x0) {
        operator_delete__(local_a0._M_head_impl);
      }
    }
    if (local_98._M_head_impl != (unsigned_short *)0x0) {
      operator_delete__(local_98._M_head_impl);
    }
  }
  if (local_78._M_head_impl != (unsigned_short *)0x0) {
    operator_delete__(local_78._M_head_impl);
  }
  return;
}

Assistant:

void AV1HighbdHiprecConvolveTest::RunCheckOutput(
    highbd_hiprec_convolve_func test_impl) {
  const int w = 128, h = 128;
  const int out_w = GET_PARAM(0), out_h = GET_PARAM(1);
  const int num_iters = GET_PARAM(2);
  const int bd = GET_PARAM(3);
  int i, j;
  const WienerConvolveParams conv_params = get_conv_params_wiener(bd);

  std::unique_ptr<uint16_t[]> input(new (std::nothrow) uint16_t[h * w]);
  ASSERT_NE(input, nullptr);

  // The AVX2 convolve functions always write rows with widths that are
  // multiples of 16. So to avoid a buffer overflow, we may need to pad
  // rows to a multiple of 16.
  int output_n = ALIGN_POWER_OF_TWO(out_w, 4) * out_h;
  std::unique_ptr<uint16_t[]> output(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output, nullptr);
  std::unique_ptr<uint16_t[]> output2(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output2, nullptr);

  // Generate random filter kernels
  DECLARE_ALIGNED(16, InterpKernel, hkernel);
  DECLARE_ALIGNED(16, InterpKernel, vkernel);

  for (i = 0; i < h; ++i)
    for (j = 0; j < w; ++j) input[i * w + j] = rnd_.Rand16() & ((1 << bd) - 1);

  uint8_t *input_ptr = CONVERT_TO_BYTEPTR(input.get());
  uint8_t *output_ptr = CONVERT_TO_BYTEPTR(output.get());
  uint8_t *output2_ptr = CONVERT_TO_BYTEPTR(output2.get());
  for (int kernel_type = 0; kernel_type < 6; kernel_type++) {
    generate_kernels(&rnd_, hkernel, vkernel, kernel_type);
    for (i = 0; i < num_iters; ++i) {
      // Choose random locations within the source block
      int offset_r = 3 + rnd_.PseudoUniform(h - out_h - 7);
      int offset_c = 3 + rnd_.PseudoUniform(w - out_w - 7);
      av1_highbd_wiener_convolve_add_src_c(
          input_ptr + offset_r * w + offset_c, w, output_ptr, out_w, hkernel,
          16, vkernel, 16, out_w, out_h, &conv_params, bd);
      test_impl(input_ptr + offset_r * w + offset_c, w, output2_ptr, out_w,
                hkernel, 16, vkernel, 16, out_w, out_h, &conv_params, bd);

      for (j = 0; j < out_w * out_h; ++j)
        ASSERT_EQ(output[j], output2[j])
            << "Pixel mismatch at index " << j << " = (" << (j % out_w) << ", "
            << (j / out_w) << ") on iteration " << i;
    }
  }
}